

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

bool __thiscall
CS248::GLResourceManager::setTextureSampler
          (GLResourceManager *this,ProgramId pid,string *paramName,TextureId texid,int textureUnit)

{
  PFNGLGETUNIFORMLOCATIONPROC p_Var1;
  GLint GVar2;
  GLchar *pGVar3;
  undefined4 in_ECX;
  GLuint in_ESI;
  int in_R8D;
  GLenum glTextureUnitEnum;
  int textureLoc;
  bool success;
  
  p_Var1 = __glewGetUniformLocation;
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  GVar2 = (*p_Var1)(in_ESI,pGVar3);
  if (-1 < GVar2) {
    (*__glewActiveTexture)(in_R8D + 0x84c0);
    glBindTexture(0xde1,in_ECX);
    (*__glewUniform1i)(GVar2,in_R8D);
  }
  return -1 < GVar2;
}

Assistant:

bool GLResourceManager::setTextureSampler(ProgramId pid, const std::string& paramName, TextureId texid, int textureUnit) {
    bool success = true;
    int textureLoc = glGetUniformLocation(pid.id, paramName.c_str());
    GLenum glTextureUnitEnum = GL_TEXTURE0 + textureUnit;
    if (textureLoc >= 0) {
        // bind the texture object given by texid to the pipeline.
        glActiveTexture(glTextureUnitEnum);
        // Cannot unbind this texture as it will point the active unit to an invalid texture
        glBindTexture(GL_TEXTURE_2D, texid.id);
        // make sure the shader knows with texture unit is providing data for the corresponding
        // shader sampler variable
        glUniform1i(textureLoc, textureUnit);
    } else {
        success = false;
    }
    return success;
}